

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O3

void __thiscall
QWidgetRepaintManager::flush
          (QWidgetRepaintManager *this,QWidget *widget,QRegion *region,
          QPlatformTextureList *widgetTextures)

{
  char *pcVar1;
  uint uVar2;
  QDebug QVar3;
  bool bVar4;
  int iVar5;
  QPoint *pQVar6;
  long lVar7;
  QLoggingCategory *pQVar8;
  long *plVar9;
  QWidget *pQVar10;
  QWindow *pQVar11;
  char *pcVar12;
  storage_type *psVar13;
  long in_FS_OFFSET;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QDebug local_b0;
  QRegion local_a8;
  QDebug local_a0;
  undefined1 local_98 [8];
  QDebug local_90;
  QDebug local_88;
  QDebug local_80;
  QPoint local_78;
  QPoint local_70;
  undefined4 uStack_68;
  undefined8 uStack_64;
  undefined4 local_5c;
  char *local_58;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = QWidget::testAttribute_helper(*(QWidget **)this,WA_DontShowOnScreen);
  if (!bVar4) {
    bVar4 = QWidget::testAttribute_helper(widget,WA_DontShowOnScreen);
    if (!bVar4) {
      pQVar6 = (QPoint *)QWidget::windowHandle(widget);
      iVar5 = QWindow::type();
      if (iVar5 != 0x21) {
        if (flush(QWidget*,QRegion_const&,QPlatformTextureList*)::fpsDebug == '\0') {
          flush();
        }
        if (flush::fpsDebug == true) {
          iVar5 = *(int *)(this + 0xa0);
          *(int *)(this + 0xa0) = iVar5 + 1;
          if (iVar5 == 0) {
            QElapsedTimer::start();
          }
          lVar7 = QElapsedTimer::elapsed();
          if (5000 < lVar7) {
            iVar5 = *(int *)(this + 0xa0);
            lVar7 = QElapsedTimer::restart();
            local_70.xp.m_i = 2;
            local_70.yp.m_i = 0;
            uStack_68 = 0;
            uStack_64 = 0;
            local_5c = 0;
            local_58 = "default";
            QMessageLogger::debug
                      ((char *)&local_70,(double)(iVar5 * 1000) / (double)lVar7,"FPS: %.1f\n");
            *(undefined4 *)(this + 0xa0) = 0;
          }
        }
        local_78.xp.m_i = 0;
        local_78.yp.m_i = 0;
        if (*(QWidget **)this != widget) {
          local_70.xp.m_i = 0;
          local_70.yp.m_i = 0;
          local_78 = QWidget::mapTo(widget,*(QWidget **)this,&local_70);
        }
        uVar2 = *(uint *)(*(long *)&widget->field_0x8 + 0x250);
        pQVar8 = QtPrivateLogging::lcWidgetPainting();
        if (((pQVar8->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
          local_58 = pQVar8->name;
          local_70.xp.m_i = 2;
          local_70.yp.m_i = 0;
          uStack_68 = 0;
          uStack_64 = 0;
          local_5c = 0;
          QMessageLogger::debug();
          QVar3.stream = local_b0.stream;
          QVar14.m_data = (storage_type *)0x8;
          QVar14.m_size = (qsizetype)local_50;
          QString::fromUtf8(QVar14);
          QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)local_50);
          if (local_50[0] != (QArrayData *)0x0) {
            LOCK();
            (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_50[0],2,0x10);
            }
          }
          if (*(QTextStream *)(local_b0.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_b0.stream,' ');
          }
          *(int *)((QTextStream *)local_b0.stream + 0x28) =
               *(int *)((QTextStream *)local_b0.stream + 0x28) + 1;
          ::operator<<((Stream *)&local_a0,&local_a8);
          QVar3.stream = local_a0.stream;
          QVar15.m_data = (storage_type *)0x2;
          QVar15.m_size = (qsizetype)local_50;
          QString::fromUtf8(QVar15);
          QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)local_50);
          if (local_50[0] != (QArrayData *)0x0) {
            LOCK();
            (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_50[0],2,0x10);
            }
          }
          if (*(QTextStream *)(local_a0.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_a0.stream,' ');
          }
          *(int *)((QTextStream *)local_a0.stream + 0x28) =
               *(int *)((QTextStream *)local_a0.stream + 0x28) + 1;
          ::operator<<((Stream *)&local_90,(QWidget *)local_98);
          QVar3.stream = local_90.stream;
          QVar16.m_data = (storage_type *)0x2;
          QVar16.m_size = (qsizetype)local_50;
          QString::fromUtf8(QVar16);
          QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)local_50);
          if (local_50[0] != (QArrayData *)0x0) {
            LOCK();
            (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_50[0],2,0x10);
            }
          }
          if (*(QTextStream *)(local_90.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_90.stream,' ');
          }
          *(int *)((QTextStream *)local_90.stream + 0x28) =
               *(int *)((QTextStream *)local_90.stream + 0x28) + 1;
          ::operator<<((Stream *)&local_80,(QWindow *)&local_88);
          QVar3.stream = local_80.stream;
          pcVar12 = "using RHI";
          if ((uVar2 >> 0x1c & 1) == 0) {
            pcVar12 = "";
          }
          psVar13 = (storage_type *)0xffffffffffffffff;
          do {
            pcVar1 = psVar13 + (long)(pcVar12 + 1);
            psVar13 = psVar13 + 1;
          } while (*pcVar1 != '\0');
          QVar17.m_data = psVar13;
          QVar17.m_size = (qsizetype)local_50;
          QString::fromUtf8(QVar17);
          QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)local_50);
          if (local_50[0] != (QArrayData *)0x0) {
            LOCK();
            (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_50[0],2,0x10);
            }
          }
          if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_80.stream,' ');
          }
          QDebug::~QDebug(&local_80);
          QDebug::~QDebug(&local_88);
          QDebug::~QDebug(&local_90);
          QDebug::~QDebug((QDebug *)local_98);
          QDebug::~QDebug(&local_a0);
          QDebug::~QDebug((QDebug *)&local_a8);
          QDebug::~QDebug(&local_b0);
        }
        if ((uVar2 >> 0x1c & 1) == 0) {
          QBackingStore::flush(*(QRegion **)(this + 8),(QWindow *)region,pQVar6);
        }
        else {
          if (widgetTextures == (QPlatformTextureList *)0x0) {
            if ((char)QtGlobalStatic::
                      Holder<(anonymous_namespace)::Q_QGS_qt_dummy_platformTextureList>::guard.
                      _q_value.super___atomic_base<signed_char>._M_i < -1) {
              widgetTextures = (QPlatformTextureList *)0x0;
            }
            else {
              widgetTextures =
                   (QPlatformTextureList *)
                   QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_dummy_platformTextureList>_>
                   ::instance();
            }
          }
          QWidgetPrivate::sendComposeStatus(widget,false);
          bVar4 = QWidget::testAttribute_helper(widget,WA_TranslucentBackground);
          plVar9 = (long *)QBackingStore::handle();
          QPaintDevice::devicePixelRatio();
          iVar5 = (**(code **)(*plVar9 + 0x20))(plVar9,pQVar6,region,&local_78,widgetTextures,bVar4)
          ;
          QWidgetPrivate::sendComposeStatus(widget,true);
          if (iVar5 == 2) {
            pQVar10 = QWidget::window(widget);
            qSendWindowChangeToTextureChildrenRecursively(pQVar10,WindowAboutToChangeInternal);
            pQVar11 = (QWindow *)QBackingStore::handle();
            QPlatformBackingStore::graphicsDeviceReportedLost(pQVar11);
            pQVar10 = QWidget::window(widget);
            qSendWindowChangeToTextureChildrenRecursively(pQVar10,WindowChangeInternal);
            QWidget::update(widget);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetRepaintManager::flush(QWidget *widget, const QRegion &region, QPlatformTextureList *widgetTextures)
{
    Q_ASSERT(!region.isEmpty() || widgetTextures);
    Q_ASSERT(widget);
    Q_ASSERT(tlw);

    if (tlw->testAttribute(Qt::WA_DontShowOnScreen) || widget->testAttribute(Qt::WA_DontShowOnScreen))
        return;

    QWindow *window = widget->windowHandle();
    // We should only be flushing to native widgets
    Q_ASSERT(window);

    // Foreign Windows do not have backing store content and must not be flushed
    if (window->type() == Qt::ForeignWindow)
        return;

    static bool fpsDebug = qEnvironmentVariableIntValue("QT_DEBUG_FPS");
    if (fpsDebug) {
        if (!perfFrames++)
            perfTime.start();
        if (perfTime.elapsed() > 5000) {
            double fps = double(perfFrames * 1000) / perfTime.restart();
            qDebug("FPS: %.1f\n", fps);
            perfFrames = 0;
        }
    }

    QPoint offset;
    if (widget != tlw)
        offset += widget->mapTo(tlw, QPoint());

    // A widget uses RHI flush if itself, or one of its non-native children
    // uses RHI for its drawing. If so, we composite the backing store raster
    // data along with textures produced by the RHI widgets.
    const bool flushWithRhi = widget->d_func()->usesRhiFlush;

    qCDebug(lcWidgetPainting) << "Flushing" << region << "of" << widget
        << "to" << window << (flushWithRhi ? "using RHI" : "");

    // A widget uses RHI flush if itself, or one of its non-native children
    // uses RHI for its drawing. If so, we composite the backing store raster
    // data along with textures produced by the RHI widgets.
    if (flushWithRhi) {
        if (!widgetTextures)
            widgetTextures = qt_dummy_platformTextureList;

        // We only need to let the widget sub-hierarchy that
        // we are flushing know that we're compositing.
        auto *widgetPrivate = QWidgetPrivate::get(widget);
        widgetPrivate->sendComposeStatus(widget, false);

        // A window may have alpha even when the app did not request
        // WA_TranslucentBackground. Therefore the compositor needs to know whether the app intends
        // to rely on translucency, in order to decide if it should clear to transparent or opaque.
        const bool translucentBackground = widget->testAttribute(Qt::WA_TranslucentBackground);

        QPlatformBackingStore::FlushResult flushResult;
        flushResult = store->handle()->rhiFlush(window,
                                                widget->devicePixelRatio(),
                                                region,
                                                offset,
                                                widgetTextures,
                                                translucentBackground);

        widgetPrivate->sendComposeStatus(widget, true);

        if (flushResult == QPlatformBackingStore::FlushFailedDueToLostDevice) {
            qSendWindowChangeToTextureChildrenRecursively(widget->window(),
                                                          QEvent::WindowAboutToChangeInternal);
            store->handle()->graphicsDeviceReportedLost(window);
            qSendWindowChangeToTextureChildrenRecursively(widget->window(),
                                                          QEvent::WindowChangeInternal);
            widget->update();
        }
    } else {
        store->flush(region, window, offset);
    }
}